

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optics.h
# Opt level: O0

Vec3fa __thiscall embree::reflect(embree *this,Vec3fa *V,Vec3fa *N,float cosi)

{
  undefined8 uVar1;
  float fVar2;
  Vec3fa VVar3;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float cosi_local;
  Vec3fa *N_local;
  Vec3fa *V_local;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  fVar2 = cosi + cosi;
  uVar1 = *(undefined8 *)((long)&N->field_0 + 8);
  local_28 = (float)*(undefined8 *)&N->field_0;
  fStack_24 = (float)((ulong)*(undefined8 *)&N->field_0 >> 0x20);
  fStack_20 = (float)uVar1;
  fStack_1c = (float)((ulong)uVar1 >> 0x20);
  VVar3.field_0.m128[3] = fVar2 * fStack_24;
  VVar3.field_0.m128[2] = fVar2 * local_28;
  uVar1 = *(undefined8 *)((long)&V->field_0 + 8);
  local_88 = (float)*(undefined8 *)&V->field_0;
  fStack_84 = (float)((ulong)*(undefined8 *)&V->field_0 >> 0x20);
  fStack_80 = (float)uVar1;
  fStack_7c = (float)((ulong)uVar1 >> 0x20);
  uVar1 = CONCAT44(fVar2 * fStack_24 - fStack_84,fVar2 * local_28 - local_88);
  *(undefined8 *)this = uVar1;
  *(ulong *)(this + 8) = CONCAT44(fVar2 * fStack_1c - fStack_7c,fVar2 * fStack_20 - fStack_80);
  VVar3.field_0._0_8_ = uVar1;
  return (Vec3fa)VVar3.field_0;
}

Assistant:

inline Vec3fa reflect(const Vec3fa &V, const Vec3fa &N, const float cosi) {
  return 2.0f*cosi*N-V;
}